

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_8f4e27::Target::DumpCompileGroup
          (Value *__return_storage_ptr__,Target *this,CompileGroup *cg)

{
  pointer other;
  Value *this_00;
  Value local_50;
  undefined1 local_21;
  CompileGroup *local_20;
  CompileGroup *cg_local;
  Target *this_local;
  Value *group;
  
  local_21 = 0;
  local_20 = cg;
  cg_local = (CompileGroup *)this;
  this_local = (Target *)__return_storage_ptr__;
  other = std::_Rb_tree_iterator<std::pair<const_Json::Value,_unsigned_int>_>::operator->
                    (&cg->Entry);
  Json::Value::Value(__return_storage_ptr__,&other->first);
  Json::Value::Value(&local_50,&local_20->SourceIndexes);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"sourceIndexes");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCompileGroup(CompileGroup& cg)
{
  Json::Value group = cg.Entry->first;
  group["sourceIndexes"] = std::move(cg.SourceIndexes);
  return group;
}